

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
string_assertion_test::iu_StrTest_x_iutest_x_NeString_Test<char16_t>::Body
          (iu_StrTest_x_iutest_x_NeString_Test<char16_t> *this)

{
  undefined *puVar1;
  AssertionResult iutest_ar;
  String Test;
  String test;
  _Alloc_hider in_stack_fffffffffffffc58;
  bool local_388;
  iuCodeMessage local_380;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_350;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_330;
  u16string local_310 [32];
  u16string local_2f0 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_2d0;
  u16string local_2b0 [32];
  u16string local_290 [32];
  u16string local_270 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_250;
  u16string local_230 [32];
  u16string local_210 [32];
  u16string local_1f0 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_1d0;
  u16string local_1b0 [32];
  Fixed local_190;
  
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&local_330,(char16_t *)text<char16_t>::test,
             (allocator<char16_t> *)&local_190);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&local_350,(char16_t *)text<char16_t>::Test,
             (allocator<char16_t> *)&local_190);
  std::__cxx11::u16string::u16string(local_1b0,&local_330);
  std::__cxx11::u16string::u16string((u16string *)&local_1d0,&local_350);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)0x30e3d1,"Test",
             (char *)local_1b0,&local_1d0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string((u16string *)&local_1d0);
  std::__cxx11::u16string::~u16string(local_1b0);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x87,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  puVar1 = text<char16_t>::test;
  std::__cxx11::u16string::u16string(local_1f0,&local_350);
  iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)"TestFixture::Text::test",
             "Test",puVar1,(char16_t *)local_1f0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string(local_1f0);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x88,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  std::__cxx11::u16string::u16string(local_210,&local_330);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)0x30e3d1,
             "TestFixture::Text::Test",(char *)local_210,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string(local_210);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x89,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  std::__cxx11::u16string::u16string(local_230,&local_330);
  std::__cxx11::u16string::u16string((u16string *)&local_250,&local_350);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)0x30e3d1,"Test",
             (char *)local_230,&local_250,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string((u16string *)&local_250);
  std::__cxx11::u16string::~u16string(local_230);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8b,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  puVar1 = text<char16_t>::test;
  std::__cxx11::u16string::u16string(local_270,&local_350);
  iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)"TestFixture::Text::test",
             "Test",puVar1,(char16_t *)local_270,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string(local_270);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8c,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  std::__cxx11::u16string::u16string(local_290,&local_330);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)0x30e3d1,
             "TestFixture::Text::Test",(char *)local_290,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string(local_290);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8d,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    std::__cxx11::string::~string((string *)&local_380);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  std::__cxx11::u16string::u16string(local_2b0,&local_330);
  std::__cxx11::u16string::u16string((u16string *)&local_2d0,&local_350);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)0x30e3d1,"Test",
             (char *)local_2b0,&local_2d0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffc58._M_p);
  std::__cxx11::u16string::~u16string((u16string *)&local_2d0);
  std::__cxx11::u16string::~u16string(local_2b0);
  if (local_388 == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8f,in_stack_fffffffffffffc58._M_p);
    local_380._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
    puVar1 = text<char16_t>::test;
    std::__cxx11::u16string::u16string(local_2f0,&local_350);
    iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
              ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)"TestFixture::Text::test",
               "Test",puVar1,(char16_t *)local_2f0,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffc58._M_p);
    std::__cxx11::u16string::~u16string(local_2f0);
    if (local_388 == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_380,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x90,in_stack_fffffffffffffc58._M_p);
      local_380._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    }
    else {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
      std::__cxx11::u16string::u16string(local_310,&local_330);
      iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
                ((AssertionResult *)&stack0xfffffffffffffc58,(internal *)0x30e3d1,
                 "TestFixture::Text::Test",(char *)local_310,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
                 (type **)in_stack_fffffffffffffc58._M_p);
      std::__cxx11::u16string::~u16string(local_310);
      if (local_388 != false) goto LAB_002cf65c;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_380,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x91,in_stack_fffffffffffffc58._M_p);
      local_380._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_380,&local_190);
    }
  }
  std::__cxx11::string::~string((string *)&local_380);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002cf65c:
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  std::__cxx11::u16string::~u16string((u16string *)&local_350);
  std::__cxx11::u16string::~u16string((u16string *)&local_330);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRNE(test, Test);
    IUTEST_INFORM_STRNE(TestFixture::Text::test, Test);
    IUTEST_INFORM_STRNE(test, TestFixture::Text::Test);

    IUTEST_EXPECT_STRNE(test, Test);
    IUTEST_EXPECT_STRNE(TestFixture::Text::test, Test);
    IUTEST_EXPECT_STRNE(test, TestFixture::Text::Test);

    IUTEST_ASSERT_STRNE(test, Test);
    IUTEST_ASSERT_STRNE(TestFixture::Text::test, Test);
    IUTEST_ASSERT_STRNE(test, TestFixture::Text::Test);
}